

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

CoeffReturnType __thiscall
Eigen::internal::
binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
::coeff(binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        *this,Index row,Index col)

{
  CoeffReturnType a;
  Index in_RDX;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *in_RSI;
  scalar_sum_op<double,_double> *in_RDI;
  result_type rVar1;
  unary_evaluator<Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>,_Eigen::internal::IndexBased,_double>
  *unaff_retaddr;
  double in_stack_ffffffffffffffe0;
  scalar_sum_op<double,_double> *row_00;
  
  row_00 = in_RDI;
  a = evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::coeff
                (in_RSI,in_RDX,(Index)in_stack_ffffffffffffffe0);
  unary_evaluator<Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>,_Eigen::internal::IndexBased,_double>
  ::coeff(unaff_retaddr,(Index)row_00,(Index)in_RSI);
  rVar1 = scalar_sum_op<double,_double>::operator()(in_RDI,a,(double *)&stack0xffffffffffffffe0);
  return rVar1;
}

Assistant:

CoeffReturnType coeff(Index row, Index col) const
  {
    return m_functor(m_lhsImpl.coeff(row, col), m_rhsImpl.coeff(row, col));
  }